

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O3

_Bool is_number(char *name)

{
  ushort *puVar1;
  bool bVar2;
  uint uVar3;
  ushort **ppuVar4;
  size_t sVar5;
  ulong uVar6;
  
  ppuVar4 = __ctype_b_loc();
  puVar1 = *ppuVar4;
  if ((*(byte *)((long)puVar1 + (long)*name * 2 + 1) & 8) == 0) {
    bVar2 = false;
  }
  else {
    sVar5 = strlen(name);
    uVar6 = 1;
    uVar3 = (uint)sVar5;
    if (1 < (int)uVar3) {
      uVar6 = 1;
      do {
        if ((*(byte *)((long)puVar1 + (long)name[uVar6] * 2 + 1) & 8) == 0) goto LAB_00114544;
        uVar6 = uVar6 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar6);
      uVar6 = sVar5 & 0xffffffff;
    }
LAB_00114544:
    bVar2 = (int)uVar3 <= (int)uVar6;
  }
  return bVar2;
}

Assistant:

static
bool is_number(
    const char *name)
{
    if (!isdigit(name[0])) {
        return false;
    }

    ecs_size_t i, s = ecs_os_strlen(name);
    for (i = 1; i < s; i ++) {
        if (!isdigit(name[i])) {
            break;
        }
    }

    return i >= s;
}